

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O2

ChVector<double> * __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeTangent
          (ChVector<double> *__return_storage_ptr__,ChElementBeamANCF_3333 *this,double xi)

{
  ChVector<double> BeamAxisTangent;
  VectorN Sxi_xi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_168;
  VectorN *local_160;
  ChVector<double> local_158;
  VectorN local_140;
  Matrix3xN local_f8;
  
  Calc_Sxi_xi_compact(this,&local_140,xi,0.0,0.0);
  CalcCoordMatrix(this,&local_f8);
  local_168 = &local_f8;
  local_160 = &local_140;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Matrix<double,3,9,1,3,9>,Eigen::Matrix<double,9,1,0,9,1>,0>>
            (&local_158,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
              *)&local_168,(type *)0x0);
  ChVector<double>::GetNormalized(__return_storage_ptr__,&local_158);
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChElementBeamANCF_3333::ComputeTangent(const double xi) {
    VectorN Sxi_xi_compact;
    Calc_Sxi_xi_compact(Sxi_xi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // partial derivative of the position vector with respect to xi (normalized coordinate along the beam axis).  In
    // general, this will not be a unit vector
    ChVector<double> BeamAxisTangent = e_bar * Sxi_xi_compact;

    return BeamAxisTangent.GetNormalized();
}